

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Var.cpp
# Opt level: O1

void __thiscall asl::Var::operator=(Var *this,char *x)

{
  int *piVar1;
  size_t sVar2;
  int iVar3;
  char *__ptr;
  anon_union_8_8_7df20137_for_Var_3 *__dest;
  Array<char> local_30;
  
  __ptr = x;
  sVar2 = strlen(x);
  iVar3 = (int)sVar2;
  if (this->_type == STRING) {
    iVar3 = iVar3 + 1;
    Array<char>::reserve((Array<char> *)&(this->field_1)._a,iVar3);
    __dest = (anon_union_8_8_7df20137_for_Var_3 *)(this->field_1)._l;
    __dest[-2]._i = iVar3;
    sVar2 = (size_t)iVar3;
  }
  else if (iVar3 < 8 && this->_type == SSTRING) {
    __dest = &this->field_1;
    sVar2 = (size_t)(iVar3 + 1);
  }
  else {
    free(this,__ptr);
    __dest = &this->field_1;
    if (7 < iVar3) {
      this->_type = STRING;
      Array<char>::alloc(&local_30,iVar3 + 1U);
      (this->field_1)._l = (Long)local_30._a;
      LOCK();
      *(int *)(local_30._a + -8) = *(int *)(local_30._a + -8) + 1;
      UNLOCK();
      LOCK();
      piVar1 = (int *)(local_30._a + -8);
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        ::free(local_30._a + -0x10);
        local_30._a = (char *)0x0;
      }
      memcpy((void *)*__dest,x,(ulong)(iVar3 + 1U));
      return;
    }
    this->_type = SSTRING;
    sVar2 = (size_t)(iVar3 + 1);
  }
  memcpy(__dest,x,sVar2);
  return;
}

Assistant:

void Var::operator=(const char* x)
{
	int n = (int)strlen(x);
	if (_type == STRING) {
		_s->resize(n + 1);
		memcpy(_s->data(), x, n + 1);
	}
	else if(_type==SSTRING && n < VAR_SSPACE)
		memcpy(_ss, x, n + 1);
	else
	{
		free();
		if(n < VAR_SSPACE)
		{
			_type = SSTRING;
			memcpy(_ss, x, n + 1);
		}
		else
		{
			_type=STRING;
			NEW_STRINGC(_s, n + 1);
			memcpy(_s->data(), x, n + 1);
		}
	}
}